

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar5;
  bool bVar6;
  uint uVar7;
  double *pdVar8;
  uint uVar9;
  FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_> *pFVar10;
  ulong uVar11;
  value_type vVar12;
  
  pFVar10 = (fadexpr->fadexpr_).left_;
  pFVar3 = (fadexpr->fadexpr_).right_;
  uVar7 = (((pFVar10->fadexpr_).right_)->dx_).num_elts;
  pFVar4 = (pFVar3->fadexpr_).left_;
  uVar1 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  pFVar4 = (pFVar3->fadexpr_).right_;
  uVar1 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar9 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar9 < (int)uVar1) {
    uVar9 = uVar1;
  }
  if ((int)uVar9 < (int)uVar2) {
    uVar9 = uVar2;
  }
  if ((int)uVar9 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar9 == uVar1) {
    if (uVar9 == 0) goto LAB_00dbe119;
    pdVar8 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar9 == 0) {
      if (uVar1 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00dbe119;
    }
    if (uVar1 != 0) {
      pdVar8 = (this->dx_).ptr_to_data;
      if (pdVar8 != (double *)0x0) {
        operator_delete__(pdVar8);
        pFVar10 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar9;
    uVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar9) {
      uVar11 = (ulong)uVar9 << 3;
    }
    pdVar8 = (double *)operator_new__(uVar11);
    (this->dx_).ptr_to_data = pdVar8;
    uVar7 = (((pFVar10->fadexpr_).right_)->dx_).num_elts;
  }
  if ((uVar7 == 0) ||
     (bVar6 = FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
              ::hasFastAccess(&((fadexpr->fadexpr_).right_)->fadexpr_), !bVar6)) {
    if (0 < (int)uVar9) {
      uVar11 = 0;
      do {
        vVar12 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar11);
        pdVar8[uVar11] = vVar12;
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
  }
  else if (0 < (int)uVar9) {
    uVar11 = 0;
    do {
      vVar12 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar11);
      pdVar8[uVar11] = vVar12;
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
LAB_00dbe119:
  pFVar10 = (fadexpr->fadexpr_).left_;
  pFVar3 = (fadexpr->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  this->val_ = ((double)(pFVar10->fadexpr_).left_.constant_ * ((pFVar10->fadexpr_).right_)->val_) /
               ((((pFVar5->fadexpr_).left_)->val_ + ((pFVar5->fadexpr_).right_)->val_) *
               (((pFVar4->fadexpr_).left_)->val_ + ((pFVar4->fadexpr_).right_)->val_));
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}